

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# task_queue_stdlib.cc
# Opt level: O3

ThreadPriority dd::TaskQueuePriorityToThreadPriority(Priority priority)

{
  ThreadPriority TVar1;
  
  TVar1 = kNormalPriority;
  if (priority < (LOW|HIGH)) {
    TVar1 = *(ThreadPriority *)(&DAT_00126bd0 + (ulong)priority * 4);
  }
  return TVar1;
}

Assistant:

ThreadPriority TaskQueuePriorityToThreadPriority(TaskQueueFactory::Priority priority)
	{
		switch (priority) {
		case TaskQueueFactory::Priority::HIGH:
			return kRealtimePriority;
		case TaskQueueFactory::Priority::LOW:
			return kLowPriority;
		case TaskQueueFactory::Priority::NORMAL:
			return kNormalPriority;
		default:
			return kNormalPriority;
		}
	}